

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_ack(quicly_conn_t *conn,st_quicly_pn_space_t *space,quicly_send_context_t *s)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  quicly_ranges_t *ranges;
  uint8_t *arg1;
  quicly_sent_t *pqVar4;
  uint8_t *puVar5;
  uint64_t *puVar6;
  uint8_t *in_RDX;
  long *in_RSI;
  st_quicly_conn_t *in_RDI;
  quicly_sent_t *sent;
  size_t i;
  quicly_conn_t *_conn_1;
  quicly_conn_t *_conn;
  uint8_t *dst;
  int ret;
  uint64_t ack_delay;
  en_quicly_send_packet_mode_t in_stack_0000007c;
  quicly_send_context_t *in_stack_00000080;
  quicly_conn_t *in_stack_00000088;
  quicly_send_context_t *in_stack_ffffffffffffffa8;
  quicly_conn_t *in_stack_ffffffffffffffb0;
  quicly_sent_acked_cb acked;
  st_quicly_conn_t *in_stack_ffffffffffffffb8;
  st_quicly_conn_t *arg0;
  uint in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RSI[1] == 0) {
    local_4 = 0;
  }
  else {
    if (in_RSI[5] < (in_RDI->stash).now) {
      ranges = (quicly_ranges_t *)(((in_RDI->stash).now - in_RSI[5]) * 1000 >> 10);
    }
    else {
      ranges = (quicly_ranges_t *)0x0;
    }
    do {
      iVar2 = allocate_frame(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x148999);
      if (iVar2 != 0) {
        return iVar2;
      }
      arg1 = quicly_encode_ack_frame
                       ((uint8_t *)in_RSI,in_RDX,ranges,(ulong)in_stack_ffffffffffffffd0);
      if (arg1 != (uint8_t *)0x0) {
        (in_RDI->super).stats.num_frames_sent.ack = (in_RDI->super).stats.num_frames_sent.ack + 1;
        arg0 = in_RDI;
        if ((quicly_trace_fp != (FILE *)0x0) &&
           (iVar3 = ptls_skip_tracing((in_RDI->crypto).tls), iVar3 == 0)) {
          QUICLY_ACK_SEND((st_quicly_conn_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                          (int64_t)arg1,(uint64_t)arg0,(uint64_t)in_stack_ffffffffffffffb8);
        }
        puVar5 = arg1;
        if (((7 < (ulong)in_RSI[1]) && (((in_RDI->egress).packet_number & 3) == 0)) &&
           (arg1 < *(uint8_t **)(in_RDX + 0x60))) {
          puVar5 = arg1 + 1;
          *arg1 = '\x01';
          (in_RDI->super).stats.num_frames_sent.ping =
               (in_RDI->super).stats.num_frames_sent.ping + 1;
          in_stack_ffffffffffffffb8 = in_RDI;
          if ((quicly_trace_fp != (FILE *)0x0) &&
             (iVar3 = ptls_skip_tracing((in_RDI->crypto).tls), in_stack_ffffffffffffffb8 = in_RDI,
             iVar3 == 0)) {
            QUICLY_PING_SEND(arg0,(int64_t)in_RDI);
            in_stack_ffffffffffffffb8 = in_RDI;
          }
        }
        *(uint8_t **)(in_RDX + 0x58) = puVar5;
        acked = (quicly_sent_acked_cb)0x0;
        while( true ) {
          if (acked == (quicly_sent_acked_cb)in_RSI[1]) {
            *(undefined4 *)(in_RSI + 7) = 0;
            return iVar2;
          }
          pqVar4 = quicly_sentmap_allocate((quicly_sentmap_t *)in_stack_ffffffffffffffb8,acked);
          if (pqVar4 == (quicly_sent_t *)0x0) break;
          puVar6 = (uint64_t *)(*in_RSI + (long)acked * 0x10);
          (pqVar4->data).packet.packet_number = *puVar6;
          (pqVar4->data).packet.sent_at = puVar6[1];
          acked = acked + 1;
        }
        return 0x201;
      }
      if (*(long *)(in_RDX + 0x58) == *(long *)(in_RDX + 0x68)) {
        if (*(long *)(in_RDX + 0x18) == *(long *)(in_RDX + 0x40)) {
          __assert_fail("s->target.first_byte_at != s->payload_buf.datagram",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0xcbc,
                        "int send_ack(quicly_conn_t *, struct st_quicly_pn_space_t *, quicly_send_context_t *)"
                       );
        }
        puVar1 = *(undefined1 **)(in_RDX + 0x58);
        *(undefined1 **)(in_RDX + 0x58) = puVar1 + 1;
        *puVar1 = 0;
      }
      local_4 = commit_send_packet(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
    } while (local_4 == 0);
  }
  return local_4;
}

Assistant:

static int send_ack(quicly_conn_t *conn, struct st_quicly_pn_space_t *space, quicly_send_context_t *s)
{
    uint64_t ack_delay;
    int ret;

    if (space->ack_queue.num_ranges == 0)
        return 0;

    /* calc ack_delay */
    if (space->largest_pn_received_at < conn->stash.now) {
        /* We underreport ack_delay up to 1 milliseconds assuming that QUICLY_LOCAL_ACK_DELAY_EXPONENT is 10. It's considered a
         * non-issue because our time measurement is at millisecond granurality anyways. */
        ack_delay = ((conn->stash.now - space->largest_pn_received_at) * 1000) >> QUICLY_LOCAL_ACK_DELAY_EXPONENT;
    } else {
        ack_delay = 0;
    }

Emit: /* emit an ACK frame */
    if ((ret = allocate_frame(conn, s, QUICLY_ACK_FRAME_CAPACITY)) != 0)
        return ret;
    uint8_t *dst = s->dst;
    dst = quicly_encode_ack_frame(dst, s->dst_end, &space->ack_queue, ack_delay);

    /* when there's no space, retry with a new MTU-sized packet */
    if (dst == NULL) {
        /* [rare case] A coalesced packet might not have enough space to hold only an ACK. If so, pad it, as that's easier than
         * rolling back. */
        if (s->dst == s->dst_payload_from) {
            assert(s->target.first_byte_at != s->payload_buf.datagram);
            *s->dst++ = QUICLY_FRAME_TYPE_PADDING;
        }
        if ((ret = commit_send_packet(conn, s, QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE)) != 0)
            return ret;
        goto Emit;
    }

    ++conn->super.stats.num_frames_sent.ack;
    QUICLY_PROBE(ACK_SEND, conn, conn->stash.now, space->ack_queue.ranges[space->ack_queue.num_ranges - 1].end - 1, ack_delay);

    /* when there are no less than QUICLY_NUM_ACK_BLOCKS_TO_INDUCE_ACKACK (8) gaps, bundle PING once every 4 packets being sent */
    if (space->ack_queue.num_ranges >= QUICLY_NUM_ACK_BLOCKS_TO_INDUCE_ACKACK && conn->egress.packet_number % 4 == 0 &&
        dst < s->dst_end) {
        *dst++ = QUICLY_FRAME_TYPE_PING;
        ++conn->super.stats.num_frames_sent.ping;
        QUICLY_PROBE(PING_SEND, conn, conn->stash.now);
    }

    s->dst = dst;

    { /* save what's inflight */
        size_t i;
        for (i = 0; i != space->ack_queue.num_ranges; ++i) {
            quicly_sent_t *sent;
            if ((sent = quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_ack_ack)) == NULL)
                return PTLS_ERROR_NO_MEMORY;
            sent->data.ack.range = space->ack_queue.ranges[i];
        }
    }

    space->unacked_count = 0;

    return ret;
}